

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

unique_ptr<pbrt::AOIntegrator,_std::default_delete<pbrt::AOIntegrator>_>
pbrt::AOIntegrator::Create
          (ParameterDictionary *parameters,SpectrumHandle *illuminant,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  bool bVar1;
  bool cosSample;
  allocator<char> local_61;
  Float local_60;
  Float maxDist;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *local_58;
  string local_50;
  
  local_58 = lights;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"cossample",(allocator<char> *)&maxDist);
  bVar1 = ParameterDictionary::GetOneBool((ParameterDictionary *)illuminant,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  cosSample = bVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"maxdistance",&local_61);
  local_60 = ParameterDictionary::GetOneFloat((ParameterDictionary *)illuminant,&local_50,INFINITY);
  std::__cxx11::string::~string((string *)&local_50);
  maxDist = local_60;
  std::
  make_unique<pbrt::AOIntegrator,bool&,float&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,pbrt::SpectrumHandle&>
            ((bool *)parameters,(float *)&cosSample,(CameraHandle *)&maxDist,sampler,aggregate,
             local_58,(SpectrumHandle *)loc);
  return (__uniq_ptr_data<pbrt::AOIntegrator,_std::default_delete<pbrt::AOIntegrator>,_true,_true>)
         (__uniq_ptr_data<pbrt::AOIntegrator,_std::default_delete<pbrt::AOIntegrator>,_true,_true>)
         parameters;
}

Assistant:

std::unique_ptr<AOIntegrator> AOIntegrator::Create(
    const ParameterDictionary &parameters, SpectrumHandle illuminant, CameraHandle camera,
    SamplerHandle sampler, PrimitiveHandle aggregate, std::vector<LightHandle> lights,
    const FileLoc *loc) {
    bool cosSample = parameters.GetOneBool("cossample", true);
    Float maxDist = parameters.GetOneFloat("maxdistance", Infinity);
    return std::make_unique<AOIntegrator>(cosSample, maxDist, camera, sampler, aggregate,
                                          lights, illuminant);
}